

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void initialize_plugins(void)

{
  undefined8 *puVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  basic_string_view<char,_std::char_traits<char>_> *plugin_name;
  pointer pbVar6;
  undefined8 *puVar7;
  char *pcVar8;
  double dVar9;
  container_type plugin_names;
  string_view plugin_list_str;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Loading plugins...");
  std::endl<char,std::char_traits<char>>(poVar2);
  plugin_list_str = (string_view)Jupiter::Config::get(Jupiter::g_config,7,"Plugins",0,0);
  if (plugin_list_str._M_len != 0) {
    local_40._M_len = 2;
    local_40._M_str = " \t";
    jessilib::
    word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
              (&plugin_names,&plugin_list_str,&local_40);
    poVar2 = std::operator<<((ostream *)&std::cout,"Attempting to load ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," plugins...");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (pbVar6 = plugin_names.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != plugin_names.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      lVar3 = std::chrono::_V2::steady_clock::now();
      lVar4 = Jupiter::Plugin::load((basic_string_view *)pbVar6);
      lVar5 = std::chrono::_V2::steady_clock::now();
      dVar9 = (double)((lVar5 - lVar3) / 1000) / 1000.0;
      if (lVar4 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: Failed to load plugin \"");
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,pbVar6->_M_str,pbVar6->_M_len);
        std::operator<<(poVar2,"\" (");
        poVar2 = std::ostream::_M_insert<double>(dVar9);
        pcVar8 = "ms)!";
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"\"");
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,pbVar6->_M_str,pbVar6->_M_len);
        std::operator<<(poVar2,"\" loaded successfully (");
        poVar2 = std::ostream::_M_insert<double>(dVar9);
        pcVar8 = "ms).";
      }
      poVar2 = std::operator<<(poVar2,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    puVar1 = (undefined8 *)Jupiter::plugins[1];
    for (puVar7 = (undefined8 *)*Jupiter::plugins; puVar7 != puVar1; puVar7 = puVar7 + 1) {
      (**(code **)(*(long *)*puVar7 + 0x30))();
    }
    std::
    _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Vector_base(&plugin_names.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   );
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"No plugins to load!");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void initialize_plugins() {
	std::cout << "Loading plugins..." << std::endl;
	std::string_view plugin_list_str = Jupiter::g_config->get("Plugins"sv);
	if (plugin_list_str.empty()) {
		std::cout << "No plugins to load!" << std::endl;
	}
	else {
		// initialize plugins
		auto plugin_names = jessilib::word_split_view(plugin_list_str, WHITESPACE_SV);
		std::cout << "Attempting to load " << plugin_names.size() << " plugins..." << std::endl;

		for (const auto& plugin_name : plugin_names) {
			std::chrono::steady_clock::time_point load_start = std::chrono::steady_clock::now();
			bool load_success = Jupiter::Plugin::load(plugin_name) != nullptr;
			double time_taken = static_cast<double>(std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - load_start).count()) / 1000.0;

			if (load_success) {
				std::cout << "\"" << plugin_name << "\" loaded successfully (" << time_taken << "ms)." << std::endl;
			}
			else {
				std::cerr << "WARNING: Failed to load plugin \"" << plugin_name << "\" (" << time_taken << "ms)!" << std::endl;
			}
		}

		// OnPostInitialize
		for (const auto& plugin : Jupiter::plugins) {
			plugin->OnPostInitialize();
		}
	}
}